

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O1

void world_draw(world_t *world_p,graphical_context_t *context_p)

{
  camera_t *camera_p;
  vec3d_t v0;
  mat4f_t m0;
  mat4f_t m0_00;
  mat4f_t m1;
  mat4f_t m1_00;
  vec3f_t v0_00;
  _Bool _Var1;
  vec3f_t vVar2;
  mat4f_t camera_matrix;
  mat4f_t matrix;
  frustum_t frustum;
  vec3f_t local_1f8;
  undefined8 local_1e8;
  float local_1e0;
  mat4f_t local_1d8;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  mat4f_t local_140;
  mat4f_t local_100;
  undefined1 local_c0 [64];
  frustum_t local_80;
  
  camera_p = context_p->camera_p;
  camera_calculate_view_relative(&local_100,camera_p);
  m1._8_8_ = local_100._8_8_;
  m1._0_8_ = local_100._0_8_;
  m1._16_8_ = local_100._16_8_;
  m1._24_8_ = local_100._24_8_;
  m1._32_8_ = local_100._32_8_;
  m1._40_8_ = local_100._40_8_;
  m1._48_8_ = local_100._48_8_;
  m1._56_8_ = local_100._56_8_;
  mat4f_mul((mat4f_t)*(anon_struct_64_16_74fe18b5_for_mat4f_t_0 *)&camera_p->projection,m1);
  frustum_create(&local_80,&local_1d8);
  vec3d_sub((world_p->chunk).position,context_p->camera_p->position);
  v0.field_0.y = (double)uStack_190;
  v0.field_0.x = (double)local_198;
  v0.field_0.z = (double)local_188;
  vVar2 = vec3d_f(v0);
  local_1f8.field_0.z = vVar2.field_0.z;
  local_1f8._0_8_ = vVar2._0_8_;
  _Var1 = frustum_box_in(&local_80,&local_1f8,4.0);
  if (_Var1) {
    mat4f_set(1.0);
    vVar2.field_0.z = local_1f8.field_0.z;
    vVar2._0_8_ = local_1f8._0_8_;
    m0._8_8_ = uStack_178;
    m0._0_8_ = local_180;
    m0._16_8_ = local_170;
    m0._24_8_ = uStack_168;
    m0._32_8_ = local_160;
    m0._40_8_ = uStack_158;
    m0._48_8_ = local_150;
    m0._56_8_ = uStack_148;
    mat4f_translate(&local_140,m0,vVar2);
    m0_00._8_8_ = local_1d8._8_8_;
    m0_00._0_8_ = local_1d8._0_8_;
    m0_00._16_8_ = local_1d8._16_8_;
    m0_00._24_8_ = local_1d8._24_8_;
    m0_00._32_8_ = local_1d8._32_8_;
    m0_00._40_8_ = local_1d8._40_8_;
    m0_00._48_8_ = local_1d8._48_8_;
    m0_00._56_8_ = local_1d8._56_8_;
    m1_00._8_8_ = local_140._8_8_;
    m1_00._0_8_ = local_140._0_8_;
    m1_00._16_8_ = local_140._16_8_;
    m1_00._24_8_ = local_140._24_8_;
    m1_00._32_8_ = local_140._32_8_;
    m1_00._40_8_ = local_140._40_8_;
    m1_00._48_8_ = local_140._48_8_;
    m1_00._56_8_ = local_140._56_8_;
    mat4f_mul(m0_00,m1_00);
    v0_00.field_0.z = local_1f8.field_0.z;
    v0_00._0_8_ = local_1f8._0_8_;
    vVar2 = vec3f_negative(v0_00);
    local_1e0 = vVar2.field_0.z;
    local_1e8 = vVar2._0_8_;
    shader_program_uniform_matrix_4fv(context_p->voxel_shader_program,"matrix_mvp",local_c0);
    shader_program_uniform3fv(context_p->voxel_shader_program,"camera_position",&local_1e8);
    chunk_draw(&world_p->chunk);
  }
  return;
}

Assistant:

void world_draw(
        world_t*             world_p,
        graphical_context_t* context_p)
{
    const mat4f_t camera_matrix = mat4f_mul(
            context_p->camera_p->projection,
            camera_calculate_view_relative(context_p->camera_p));

    frustum_t frustum;
    frustum_create(&frustum, &camera_matrix);
    
    const vec3f_t displacement = vec3d_f(vec3d_sub(
            world_p->chunk.position,
            context_p->camera_p->position));

    if (frustum_box_in(&frustum, &displacement, CHUNK_HALF_SIZE))
    {
        const mat4f_t matrix = mat4f_mul(
                camera_matrix,
                mat4f_translate(mat4f_set(1.0f), displacement));

        const vec3f_t camera_position = vec3f_negative(displacement);

        shader_program_uniform_matrix_4fv(
                context_p->voxel_shader_program,
                "matrix_mvp",
                matrix.pointer);

        shader_program_uniform3fv(
                context_p->voxel_shader_program, 
                "camera_position",
                camera_position.pointer);

        chunk_draw(&world_p->chunk);
    }
}